

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_dummy.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::SetCommissionerDataset
          (Error *__return_storage_ptr__,CommissionerApp *this,CommissionerDataset *aDataset)

{
  CommissionerDataset *aDataset_local;
  CommissionerApp *this_local;
  
  Error::Error(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetCommissionerDataset(const CommissionerDataset &aDataset)
{
    UNUSED(aDataset);
    return Error{};
}